

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetBXPortStatus(ndicapi *pol,int portHandle)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  bVar1 = pol->BxHandleCount;
  iVar2 = 0;
  uVar4 = 0;
  if (bVar1 != 0) {
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      if (pol->BxHandles[uVar3] == portHandle) break;
      uVar3 = uVar3 + 1;
      uVar4 = (ulong)bVar1;
    } while (bVar1 != uVar3);
  }
  if ((uint)uVar4 != (uint)bVar1) {
    iVar2 = pol->BxPortStatus[uVar4 & 0xffffffff];
  }
  return iVar2;
}

Assistant:

ndicapiExport int ndiGetBXPortStatus(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->BxPortStatus[i];
}